

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

size_type __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::erase(sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        *this,key_type *key)

{
  size_type sVar1;
  bool bVar2;
  iterator local_108;
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_b8;
  const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
  cStack_b0;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *psStack_90;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_88;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *psStack_80;
  nonempty_iterator local_78;
  iterator local_68;
  
  find<int>(&local_108,this,key);
  local_b8 = local_108.ht;
  cStack_b0.row_begin._M_current = local_108.pos.row_begin._M_current;
  cStack_b0.row_end._M_current = local_108.pos.row_end._M_current;
  cStack_b0.row_current._M_current = local_108.pos.row_current._M_current;
  cStack_b0.col_current = local_108.pos.col_current;
  psStack_90 = local_108.end.row_begin._M_current;
  local_88 = local_108.end.row_end._M_current;
  psStack_80 = local_108.end.row_current._M_current;
  local_78 = local_108.end.col_current;
  end(&local_68,this);
  local_108.ht = local_68.ht;
  local_108.pos.row_begin._M_current = local_68.pos.row_begin._M_current;
  local_108.pos.row_end._M_current = local_68.pos.row_end._M_current;
  local_108.pos.row_current._M_current = local_68.pos.row_current._M_current;
  local_108.pos.col_current = local_68.pos.col_current;
  local_108.end.row_begin._M_current = local_68.end.row_begin._M_current;
  local_108.end.row_end._M_current = local_68.end.row_end._M_current;
  local_108.end.row_current._M_current = local_68.end.row_current._M_current;
  local_108.end.col_current = local_68.end.col_current;
  bVar2 = const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
          ::operator!=(&cStack_b0,(iterator *)&local_108.pos);
  if (bVar2) {
    sVar1 = this->num_deleted;
    (cStack_b0.col_current)->first = (this->key_info).delkey;
    (cStack_b0.col_current)->second = 0;
    this->num_deleted = sVar1 + 1;
    (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
    consider_shrink_ = true;
  }
  return (ulong)bVar2;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not erasing delkey.
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    assert(!settings.use_deleted() || !equals(key, key_info.delkey));
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
      return 1;  // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }